

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_mdtm_resp(connectdata *conn,int ftpcode)

{
  curl_TimeCond cVar1;
  SessionHandle *data;
  void *pvVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  time_t tVar8;
  CURLcode CVar9;
  char *pcVar10;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  char *local_78;
  ulong local_70;
  time_t secs;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  if (ftpcode == 0x226) {
    Curl_failf(data,"Given file does not exist");
    CVar7 = CURLE_FTP_COULDNT_RETR_FILE;
  }
  else if (ftpcode == 0xd5) {
    local_78 = (data->state).buffer;
    CVar9 = CURLE_OK;
    iVar6 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day,
                            &hour,&minute,&second);
    if (iVar6 == 6) {
      secs = time((time_t *)0x0);
      pcVar10 = local_78;
      curl_msnprintf(local_78,0x4001,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                     (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                     (ulong)(uint)second);
      tVar8 = curl_getdate(pcVar10,&secs);
      (data->info).filetime = tVar8;
    }
    bVar5 = true;
    CVar7 = CURLE_OK;
    if (((((data->set).opt_no_body == true) &&
         (CVar7 = CVar9, (conn->proto).ftpc.file != (char *)0x0)) &&
        ((data->set).get_filetime == true)) && (lVar3 = (data->info).filetime, -1 < lVar3)) {
      CVar7 = Curl_gmtime(lVar3,(tm *)&secs);
      pcVar10 = local_78;
      if (CVar7 == CURLE_OK) {
        iVar6 = 6;
        if (local_50 != 0) {
          iVar6 = local_50 + -1;
        }
        local_70 = (ulong)local_60;
        bVar5 = false;
        curl_msnprintf(local_78,0x3fff,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                       Curl_wkday[iVar6],(ulong)local_5c,Curl_month[local_58],
                       (ulong)(local_54 + 0x76c),local_70,(ulong)secs >> 0x20,secs & 0xffffffff);
        CVar7 = Curl_client_write(conn,3,pcVar10,0);
        if (CVar7 == CURLE_OK) {
          bVar5 = true;
          CVar7 = CURLE_OK;
        }
      }
      else {
        bVar5 = false;
      }
    }
    if (!bVar5) {
      return CVar7;
    }
  }
  else {
    CVar7 = CURLE_OK;
    Curl_infof(data,"unsupported MDTM reply format\n");
  }
  cVar1 = (data->set).timecondition;
  if (cVar1 != CURL_TIMECOND_NONE) {
    lVar3 = (data->info).filetime;
    if ((lVar3 < 1) || (lVar4 = (data->set).timevalue, lVar4 < 1)) {
      Curl_infof(data,"Skipping time comparison\n");
    }
    else if (cVar1 == CURL_TIMECOND_IFUNMODSINCE) {
      if (lVar4 < lVar3) {
        pcVar10 = "The requested document is not old enough\n";
LAB_001328d8:
        Curl_infof(data,pcVar10);
        *(undefined4 *)((long)pvVar2 + 0x18) = 2;
        (data->info).timecond = true;
        (conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
    }
    else if (lVar3 <= lVar4) {
      pcVar10 = "The requested document is not new enough\n";
      goto LAB_001328d8;
    }
  }
  if (CVar7 == CURLE_OK) {
    CVar7 = ftp_state_type(conn);
  }
  return CVar7;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct connectdata *conn,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data=conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      char *buf = data->state.buffer;
      if(6 == sscanf(buf+4, "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        time_t secs=time(NULL);
        /* using the good old yacc/bison yuck */
        snprintf(buf, sizeof(conn->data->state.buffer),
                 "%04d%02d%02d %02d:%02d:%02d GMT",
                 year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = (long)curl_getdate(buf, &secs);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime>=0) ) {
        time_t filetime = (time_t)data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        snprintf(buf, BUFSIZE-1,
                 "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                 Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                 tm->tm_mday,
                 Curl_month[tm->tm_mon],
                 tm->tm_year + 1900,
                 tm->tm_hour,
                 tm->tm_min,
                 tm->tm_sec);
        result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format\n");
    break;
  case 550: /* "No such file or directory" */
    failf(data, "Given file does not exist");
    result = CURLE_FTP_COULDNT_RETR_FILE;
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison\n");
    }
  }

  if(!result)
    result = ftp_state_type(conn);

  return result;
}